

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O2

int license::LicenseGenerator::generateLicense(int argc,char **argv)

{
  char cVar1;
  options_description *this;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar2;
  basic_command_line_parser<char> *this_00;
  size_type sVar3;
  any *operand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  int *piVar6;
  char *pcVar7;
  allocator local_431;
  string fname;
  positional_options_description p;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_3c0 [144];
  fstream ofstream;
  ostream local_320 [512];
  options_description allOptions;
  options_description visibleOptions;
  
  configureProgramOptions();
  boost::program_options::options_description::options_description(&allOptions,0x50,0x28);
  this = (options_description *)
         boost::program_options::options_description::add(&allOptions,&visibleOptions);
  _ofstream = (pointer)boost::program_options::options_description::add_options(this);
  ptVar2 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)&ofstream,"product",(value_semantic *)ptVar2,
             "product names");
  boost::program_options::positional_options_description::positional_options_description(&p);
  boost::program_options::positional_options_description::add(&p,"product",-1);
  boost::program_options::variables_map::variables_map(&vm);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&ofstream,argc,argv);
  this_00 = boost::program_options::basic_command_line_parser<char>::options
                      ((basic_command_line_parser<char> *)&ofstream,&allOptions);
  boost::program_options::detail::cmdline::set_positional_options(&this_00->super_cmdline,&p);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&fname,this_00);
  boost::program_options::store((basic_parsed_options *)&fname,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&fname);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&ofstream);
  boost::program_options::notify(&vm);
  std::__cxx11::string::string((string *)&ofstream,"help",(allocator *)&fname);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_3c0,(key_type *)&ofstream);
  std::__cxx11::string::~string((string *)&ofstream);
  if ((argc == 1) || (sVar3 != 0)) {
    printHelp(*argv,&visibleOptions);
  }
  else {
    std::__cxx11::string::string((string *)&ofstream,"output",(allocator *)&fname);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_3c0,(key_type *)&ofstream);
    std::__cxx11::string::~string((string *)&ofstream);
    if (sVar3 == 0) {
      generateAndOutputLicenses(&vm,(ostream *)std::cout);
    }
    else {
      std::__cxx11::string::string((string *)&ofstream,"output",&local_431);
      operand = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((abstract_variables_map *)&vm,(string *)&ofstream);
      pbVar4 = boost::any_cast<std::__cxx11::string_const&>(operand);
      std::__cxx11::string::string((string *)&fname,(string *)pbVar4);
      std::__cxx11::string::~string((string *)&ofstream);
      std::fstream::fstream(&ofstream,(string *)&fname,_S_out|_S_app);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        poVar5 = std::operator<<((ostream *)&std::cerr,"can\'t open file [");
        poVar5 = std::operator<<(poVar5,(string *)&fname);
        poVar5 = std::operator<<(poVar5,"] for output.");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5," error: ");
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        std::operator<<(poVar5,pcVar7);
        exit(3);
      }
      generateAndOutputLicenses(&vm,local_320);
      std::fstream::close();
      std::fstream::~fstream(&ofstream);
      std::__cxx11::string::~string((string *)&fname);
    }
  }
  boost::program_options::variables_map::~variables_map(&vm);
  boost::program_options::positional_options_description::~positional_options_description(&p);
  boost::program_options::options_description::~options_description(&allOptions);
  boost::program_options::options_description::~options_description(&visibleOptions);
  return 0;
}

Assistant:

int LicenseGenerator::generateLicense(int argc, const char **argv) {

	po::options_description visibleOptions = configureProgramOptions();
	//positional options must be added to standard options
	po::options_description allOptions;
	allOptions.add(visibleOptions).add_options()("product",
			po::value<vector<string>>(), "product names");

	po::positional_options_description p;
	p.add("product", -1);

	po::variables_map vm;
	po::store(
			po::command_line_parser(argc, argv).options(allOptions).positional(
					p).run(), vm);
	po::notify(vm);
	if (vm.count("help") || argc == 1) {
		printHelp(argv[0], visibleOptions);
		return 0;
	}

	if (vm.count("output")) {
		const std::string fname = vm["output"].as<string>();

		fstream ofstream(fname, std::ios::out | std::ios::app);
		if (!ofstream.is_open()) {
			cerr << "can't open file [" << fname << "] for output." << endl
					<< " error: " << strerror( errno);
			exit(3);
		}
		generateAndOutputLicenses(vm, ofstream);
		ofstream.close();
	} else {
		generateAndOutputLicenses(vm, cout);
	}
	return 0;
}